

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
                 *this,Index target,Index eventIndex)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
  *targetColumn;
  pointer pIVar1;
  Zp_field_operators<unsigned_int,_void> *this_00;
  node_ptr plVar2;
  uint uVar3;
  int iVar4;
  undefined1 *puVar5;
  uint uVar6;
  uint local_48;
  Index local_44;
  pointer local_40;
  Column_support *local_38;
  
  pIVar1 = (this->reducedMatrixR_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40 = pIVar1 + target;
  local_38 = &pIVar1[target].column_;
  puVar5 = *(undefined1 **)&(local_38->super_type).data_.root_plus_size_;
  local_44 = target;
  while( true ) {
    uVar3 = 0xffffffff;
    uVar6 = 0xffffffff;
    if ((Column_support *)puVar5 != local_38 && puVar5 != (undefined1 *)0x0) {
      uVar6 = *(uint *)&(*(node_ptr *)((long)&(local_40->column_).super_type.data_ + 8))[1].next_;
    }
    if (uVar6 != 0xffffffff) {
      uVar3 = (this->pivotToColumnIndex_).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6];
    }
    if ((uVar6 == 0xffffffff) || (uVar3 == 0xffffffff)) break;
    pIVar1 = (this->reducedMatrixR_).matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = *(undefined1 **)&pIVar1[uVar3].column_.super_type.data_.root_plus_size_;
    uVar6 = 0;
    if ((Column_support *)puVar5 != &pIVar1[uVar3].column_ && puVar5 != (undefined1 *)0x0) {
      uVar6 = *(uint *)&pIVar1[uVar3].column_.super_type.data_.root_plus_size_.m_header.super_node.
                        prev_[-1].prev_;
    }
    this_00 = this->operators_;
    if (this_00->characteristic_ <= uVar6) {
      uVar6 = uVar6 % this_00->characteristic_;
    }
    targetColumn = pIVar1 + target;
    local_48 = (this_00->inverse_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar6];
    plVar2 = (targetColumn->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
    iVar4 = 0;
    if (plVar2 != (node_ptr)&targetColumn->column_ && plVar2 != (node_ptr)0x0) {
      iVar4 = *(int *)&(targetColumn->column_).super_type.data_.root_plus_size_.m_header.super_node.
                       prev_[-1].prev_;
    }
    persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
              (this_00,&local_48,this_00->characteristic_ - iVar4);
    _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>>
              (&local_48,pIVar1 + uVar3,targetColumn);
    pIVar1 = (this->mirrorMatrixU_).matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true>>>>
              (&local_48,pIVar1 + uVar3,pIVar1 + target);
    puVar5 = *(undefined1 **)&(local_38->super_type).data_.root_plus_size_;
  }
  if (uVar6 == 0xffffffff) {
    RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
    ::_add_bar(&this->super_RU_pairing_option,
               (this->reducedMatrixR_).matrix_.
               super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[target].super_Column_dimension_option.dim_,
               eventIndex);
  }
  else {
    (this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar6] = local_44;
    RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>
    ::_update_barcode(&this->super_RU_pairing_option,uVar6,eventIndex);
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}